

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

bool __thiscall flexbuffers::Verifier::VerifyKeys(Verifier *this,uint8_t *p,uint8_t byte_width)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  Reference r;
  
  uVar2 = CONCAT71(in_register_00000011,byte_width) & 0xffffffff;
  if (uVar2 * 3 <= (ulong)((long)p - (long)this->buf_)) {
    r.data_ = (ulong *)(p + uVar2 * -3);
    if (byte_width < 4) {
      if (byte_width < 2) {
        uVar4 = (ulong)(byte)*r.data_;
      }
      else {
        uVar4 = (ulong)(ushort)*r.data_;
      }
    }
    else if (byte_width < 8) {
      uVar4 = (ulong)(uint)*r.data_;
    }
    else {
      uVar4 = *r.data_;
    }
    if (uVar4 <= (ulong)((long)r.data_ - (long)this->buf_) && uVar4 <= this->size_) {
      if (byte_width < 4) {
        if (byte_width < 2) {
          uVar3 = (uint)*(byte *)((long)r.data_ + uVar2);
        }
        else {
          uVar3 = (uint)*(ushort *)((long)r.data_ + uVar2);
        }
      }
      else if (byte_width < 8) {
        uVar3 = *(uint *)((long)r.data_ + uVar2);
      }
      else {
        uVar3 = (uint)*(undefined8 *)((long)r.data_ + uVar2);
      }
      if (((byte)uVar3 < 9) && ((0x116U >> (uVar3 & 0x1f) & 1) != 0)) {
        r._8_8_ = (uVar3 & 0xff) << 8 | uVar2 | 0xe00000000;
        bVar1 = VerifyVector(this,r,(uint8_t *)((long)r.data_ - uVar4),FBT_KEY);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool VerifyKeys(const uint8_t *p, uint8_t byte_width) {
    // The vector part of the map has already been verified.
    const size_t num_prefixed_fields = 3;
    if (!VerifyBeforePointer(p, byte_width * num_prefixed_fields)) return false;
    p -= byte_width * num_prefixed_fields;
    auto off = ReadUInt64(p, byte_width);
    if (!VerifyOffset(off, p)) return false;
    auto key_byte_with =
        static_cast<uint8_t>(ReadUInt64(p + byte_width, byte_width));
    if (!VerifyByteWidth(key_byte_with)) return false;
    return VerifyVector(Reference(p, byte_width, key_byte_with, FBT_VECTOR_KEY),
                        p - off, FBT_KEY);
  }